

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_core.hpp
# Opt level: O0

void __thiscall
asio::ssl::detail::stream_core::stream_core<asio::any_io_executor>
          (stream_core *this,SSL_CTX *context,any_io_executor *ex)

{
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *this_00;
  time_point expiry_time;
  long in_RDI;
  mutable_buffers_1 mVar1;
  executor_type *in_stack_ffffffffffffff38;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff50;
  SSL_CTX *in_stack_ffffffffffffff58;
  engine *in_stack_ffffffffffffff60;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  engine::engine(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x256360);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60,
             (size_type)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x256383);
  mVar1 = buffer<unsigned_char,std::allocator<unsigned_char>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff40);
  local_38 = mVar1.super_mutable_buffer.data_;
  uStack_30 = mVar1.super_mutable_buffer.size_;
  *(void **)(in_RDI + 0x118) = local_38;
  *(size_t *)(in_RDI + 0x120) = uStack_30;
  this_00 = (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
             *)(in_RDI + 0x128);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2563d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (size_type)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2563fb);
  mVar1 = buffer<unsigned_char,std::allocator<unsigned_char>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff40);
  local_50 = mVar1.super_mutable_buffer.data_;
  uStack_48 = mVar1.super_mutable_buffer.size_;
  *(void **)(in_RDI + 0x140) = local_50;
  *(size_t *)(in_RDI + 0x148) = uStack_48;
  const_buffer::const_buffer((const_buffer *)(in_RDI + 0x150));
  expiry_time = neg_infin();
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_at(this_00,(time_point *)expiry_time.__d.__r);
  neg_infin();
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_at(this_00,(time_point *)expiry_time.__d.__r);
  return;
}

Assistant:

stream_core(SSL_CTX* context, const Executor& ex)
    : engine_(context),
      pending_read_(ex),
      pending_write_(ex),
      output_buffer_space_(max_tls_record_size),
      output_buffer_(asio::buffer(output_buffer_space_)),
      input_buffer_space_(max_tls_record_size),
      input_buffer_(asio::buffer(input_buffer_space_))
  {
    pending_read_.expires_at(neg_infin());
    pending_write_.expires_at(neg_infin());
  }